

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnCallIndirectExpr
          (ExprVisitorDelegate *this,CallIndirectExpr *expr)

{
  WatWriter *this_00;
  char *s;
  NextChar next_char;
  
  this_00 = this->writer_;
  s = Opcode::GetName((Opcode *)&Opcode::CallIndirect_Opcode);
  WritePutsSpace(this_00,s);
  WriteVarUnlessZero(this->writer_,&expr->table,next_char);
  WriteOpenSpace(this->writer_,"type");
  WriteVar(this->writer_,&(expr->decl).type_var,Newline);
  WriteCloseNewline(this->writer_);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnCallIndirectExpr(
    CallIndirectExpr* expr) {
  writer_->WritePutsSpace(Opcode::CallIndirect_Opcode.GetName());
  writer_->WriteVarUnlessZero(expr->table, NextChar::Space);
  writer_->WriteOpenSpace("type");
  writer_->WriteVar(expr->decl.type_var, NextChar::Newline);
  writer_->WriteCloseNewline();
  return Result::Ok;
}